

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cpp
# Opt level: O0

size_t FindBlocksDistance(uint16_t *data,size_t length,double block_switch_bitcost,
                         size_t num_histograms,HistogramDistance *histograms,double *insert_cost,
                         double *cost,uint8_t *switch_signal,uint8_t *block_id)

{
  double dVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long in_RCX;
  long lVar7;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  void *in_R8;
  void *in_R9;
  double in_XMM0_Qa;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  void *in_stack_00000008;
  long in_stack_00000010;
  uint8_t mask_1;
  uint8_t cur_id;
  size_t ix_1;
  uint8_t mask;
  size_t k;
  double block_switch_cost;
  double min_cost;
  size_t insert_cost_ix;
  size_t symbol;
  size_t ix;
  size_t j;
  size_t i;
  size_t byte_ix;
  size_t num_blocks;
  size_t bitmap_len;
  size_t alphabet_size;
  double local_f0;
  byte local_d9;
  long local_d8;
  ulong local_c8;
  double local_c0;
  double local_b8;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  size_t local_80;
  size_t local_30;
  double local_20;
  double local_8;
  
  uVar4 = in_RDX + 7 >> 3;
  local_80 = 1;
  if (in_RDX < 2) {
    for (local_90 = 0; local_90 < in_RSI; local_90 = local_90 + 1) {
      *(undefined1 *)(in_stack_00000010 + local_90) = 0;
    }
    local_30 = 1;
  }
  else {
    memset(in_R8,0,in_RDX * 0x1100);
    for (local_90 = 0; local_90 < in_RDX; local_90 = local_90 + 1) {
      uVar6 = *(ulong *)(in_RCX + local_90 * 0x890 + 0x880);
      uVar5 = uVar6 & 0xffffffff;
      if (uVar5 < 0x100) {
        local_20 = *(double *)(duckdb_brotli::kBrotliLog2Table + uVar5 * 8);
      }
      else {
        auVar8._8_4_ = 0;
        auVar8._0_8_ = uVar5;
        auVar8._12_4_ = 0x45300000;
        local_20 = log2((auVar8._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0));
      }
      *(double *)((long)in_R8 + local_90 * 8) = local_20;
    }
    local_90 = 0x220;
    while (local_90 != 0) {
      local_90 = local_90 + -1;
      for (local_98 = 0; local_98 < in_RDX; local_98 = local_98 + 1) {
        dVar1 = *(double *)((long)in_R8 + local_98 * 8);
        uVar3 = *(uint *)(in_RCX + local_98 * 0x890 + local_90 * 4);
        uVar6 = CONCAT44(0,uVar3);
        if (uVar6 == 0) {
          local_f0 = -2.0;
        }
        else {
          if (uVar6 < 0x100) {
            local_8 = *(double *)(duckdb_brotli::kBrotliLog2Table + uVar6 * 8);
          }
          else {
            auVar9._8_4_ = 0;
            auVar9._0_8_ = uVar6;
            auVar9._12_4_ = 0x45300000;
            local_8 = log2((auVar9._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,uVar3) - 4503599627370496.0));
          }
          local_f0 = local_8;
        }
        *(double *)((long)in_R8 + (local_90 * in_RDX + local_98) * 8) = dVar1 - local_f0;
      }
    }
    memset(in_R9,0,in_RDX << 3);
    memset(in_stack_00000008,0,in_RSI * uVar4);
    for (local_88 = 0; local_88 < in_RSI; local_88 = local_88 + 1) {
      uVar2 = *(ushort *)(in_RDI + local_88 * 2);
      local_b8 = 1e+99;
      for (local_c8 = 0; local_c8 < in_RDX; local_c8 = local_c8 + 1) {
        *(double *)((long)in_R9 + local_c8 * 8) =
             *(double *)((long)in_R8 + (uVar2 * in_RDX + local_c8) * 8) +
             *(double *)((long)in_R9 + local_c8 * 8);
        if (*(double *)((long)in_R9 + local_c8 * 8) < local_b8) {
          local_b8 = *(double *)((long)in_R9 + local_c8 * 8);
          *(char *)(in_stack_00000010 + local_88) = (char)local_c8;
        }
      }
      local_c0 = in_XMM0_Qa;
      if (local_88 < 2000) {
        auVar10._8_4_ = (int)(local_88 >> 0x20);
        auVar10._0_8_ = local_88;
        auVar10._12_4_ = 0x45300000;
        local_c0 = ((((auVar10._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)local_88) - 4503599627370496.0)) * 0.07) /
                    2000.0 + 0.77) * in_XMM0_Qa;
      }
      for (local_c8 = 0; local_c8 < in_RDX; local_c8 = local_c8 + 1) {
        *(double *)((long)in_R9 + local_c8 * 8) = *(double *)((long)in_R9 + local_c8 * 8) - local_b8
        ;
        if (local_c0 <= *(double *)((long)in_R9 + local_c8 * 8)) {
          *(double *)((long)in_R9 + local_c8 * 8) = local_c0;
          lVar7 = local_88 * uVar4 + (local_c8 >> 3);
          *(byte *)((long)in_stack_00000008 + lVar7) =
               *(byte *)((long)in_stack_00000008 + lVar7) | (byte)(1 << ((byte)local_c8 & 7));
        }
      }
    }
    local_88 = in_RSI - 1;
    local_d8 = local_88 * uVar4;
    local_d9 = *(byte *)(in_stack_00000010 + local_88);
    while (local_88 != 0) {
      local_88 = local_88 + -1;
      local_d8 = local_d8 - uVar4;
      if (((*(byte *)((long)in_stack_00000008 + local_d8 + ((int)(uint)local_d9 >> 3)) &
           (byte)(1 << (local_d9 & 7))) != 0) &&
         (local_d9 != *(byte *)(in_stack_00000010 + local_88))) {
        local_d9 = *(byte *)(in_stack_00000010 + local_88);
        local_80 = local_80 + 1;
      }
      *(byte *)(in_stack_00000010 + local_88) = local_d9;
    }
    local_30 = local_80;
  }
  return local_30;
}

Assistant:

static size_t FN(FindBlocks)(const DataType* data, const size_t length,
                             const double block_switch_bitcost,
                             const size_t num_histograms,
                             const HistogramType* histograms,
                             double* insert_cost,
                             double* cost,
                             uint8_t* switch_signal,
                             uint8_t* block_id) {
  const size_t alphabet_size = FN(HistogramDataSize)();
  const size_t bitmap_len = (num_histograms + 7) >> 3;
  size_t num_blocks = 1;
  size_t byte_ix;
  size_t i;
  size_t j;
  BROTLI_DCHECK(num_histograms <= 256);

  /* Trivial case: single historgram -> single block type. */
  if (num_histograms <= 1) {
    for (i = 0; i < length; ++i) {
      block_id[i] = 0;
    }
    return 1;
  }

  /* Fill bitcost for each symbol of all histograms.
   * Non-existing symbol cost: 2 + log2(total_count).
   * Regular symbol cost: -log2(symbol_count / total_count). */
  memset(insert_cost, 0,
         sizeof(insert_cost[0]) * alphabet_size * num_histograms);
  for (i = 0; i < num_histograms; ++i) {
    insert_cost[i] = FastLog2((uint32_t)histograms[i].total_count_);
  }
  for (i = alphabet_size; i != 0;) {
    /* Reverse order to use the 0-th row as a temporary storage. */
    --i;
    for (j = 0; j < num_histograms; ++j) {
      insert_cost[i * num_histograms + j] =
          insert_cost[j] - BitCost(histograms[j].data_[i]);
    }
  }

  /* After each iteration of this loop, cost[k] will contain the difference
     between the minimum cost of arriving at the current byte position using
     entropy code k, and the minimum cost of arriving at the current byte
     position. This difference is capped at the block switch cost, and if it
     reaches block switch cost, it means that when we trace back from the last
     position, we need to switch here. */
  memset(cost, 0, sizeof(cost[0]) * num_histograms);
  memset(switch_signal, 0, sizeof(switch_signal[0]) * length * bitmap_len);
  for (byte_ix = 0; byte_ix < length; ++byte_ix) {
    size_t ix = byte_ix * bitmap_len;
    size_t symbol = data[byte_ix];
    size_t insert_cost_ix = symbol * num_histograms;
    double min_cost = 1e99;
    double block_switch_cost = block_switch_bitcost;
    size_t k;
    for (k = 0; k < num_histograms; ++k) {
      /* We are coding the symbol with entropy code k. */
      cost[k] += insert_cost[insert_cost_ix + k];
      if (cost[k] < min_cost) {
        min_cost = cost[k];
        block_id[byte_ix] = (uint8_t)k;
      }
    }
    /* More blocks for the beginning. */
    if (byte_ix < 2000) {
      block_switch_cost *= 0.77 + 0.07 * (double)byte_ix / 2000;
    }
    for (k = 0; k < num_histograms; ++k) {
      cost[k] -= min_cost;
      if (cost[k] >= block_switch_cost) {
        const uint8_t mask = (uint8_t)(1u << (k & 7));
        cost[k] = block_switch_cost;
        BROTLI_DCHECK((k >> 3) < bitmap_len);
        switch_signal[ix + (k >> 3)] |= mask;
      }
    }
  }

  byte_ix = length - 1;
  {  /* Trace back from the last position and switch at the marked places. */
    size_t ix = byte_ix * bitmap_len;
    uint8_t cur_id = block_id[byte_ix];
    while (byte_ix > 0) {
      const uint8_t mask = (uint8_t)(1u << (cur_id & 7));
      BROTLI_DCHECK(((size_t)cur_id >> 3) < bitmap_len);
      --byte_ix;
      ix -= bitmap_len;
      if (switch_signal[ix + (cur_id >> 3)] & mask) {
        if (cur_id != block_id[byte_ix]) {
          cur_id = block_id[byte_ix];
          ++num_blocks;
        }
      }
      block_id[byte_ix] = cur_id;
    }
  }
  return num_blocks;
}